

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::DistanceAwareCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
          (DistanceAwareCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,DistanceType dist_type,
          SourceTargetPair p,int max_flow_intensity,int random_seed)

{
  BasicCutter *in_RCX;
  SourceTargetPair in_RDX;
  ArrayIDFunc<int> *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  TemporaryData *in_R9;
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int max_flow_intensity_00;
  TemporaryData *tmp_00;
  
  max_flow_intensity_00 = (int)((ulong)in_RDI >> 0x20);
  tmp_00 = in_R9;
  BasicCutter::
  init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
            (in_RCX,(Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
                     *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_R9,
             (BreadthFirstSearch *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_RDX,max_flow_intensity_00);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),(result_type)in_R9);
  if ((in_R8D != 0) && (in_R8D == 1)) {
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (unaff_retaddr,tmp_00,max_flow_intensity_00,in_RSI);
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (unaff_retaddr,tmp_00,max_flow_intensity_00,in_RSI);
  }
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, DistanceType dist_type,
        SourceTargetPair p, int max_flow_intensity, int random_seed)
    {
        cutter.init(graph, tmp, search_algo, p, max_flow_intensity);

        rng.seed(random_seed);

        switch (dist_type) {
        case DistanceType::hop_distance:
            compute_hop_distance_from(graph, tmp, p.source, node_dist[source_side]);
            compute_hop_distance_from(graph, tmp, p.target, node_dist[target_side]);
            break;
        case DistanceType::no_distance:
            break;
        default:
            assert(false);
            break;
        }
    }